

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

QRect __thiscall QToolBarAreaLayout::rectHint(QToolBarAreaLayout *this,QRect *r)

{
  bool bVar1;
  undefined4 uVar2;
  long lVar3;
  undefined4 uVar4;
  ulong uVar5;
  QSize QVar6;
  QSize QVar7;
  QSize QVar8;
  QSize QVar9;
  Representation RVar10;
  uint uVar11;
  QRect QVar12;
  
  bVar1 = this->visible;
  uVar11 = bVar1 - 1 | 1;
  lVar3 = *(long *)r;
  uVar2 = r->x2;
  uVar4 = r->y2;
  QVar6 = QToolBarAreaLayoutInfo::sizeHint(this->docks);
  QVar7 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 1);
  QVar8 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 2);
  QVar9 = QToolBarAreaLayoutInfo::sizeHint(this->docks + 3);
  RVar10.m_i = -QVar6.wd.m_i.m_i;
  uVar5 = (ulong)(uint)-QVar8.ht.m_i.m_i;
  if (bVar1 == false) {
    RVar10.m_i = QVar6.wd.m_i.m_i;
    uVar5 = (ulong)QVar8 >> 0x20;
  }
  QVar12.x2.m_i = uVar2 + QVar7.wd.m_i.m_i * uVar11;
  QVar12.y2.m_i = uVar4 + uVar11 * QVar9.ht.m_i.m_i;
  QVar12._0_8_ = (ulong)(uint)((int)lVar3 + RVar10.m_i) |
                 (uVar5 << 0x20) + lVar3 & 0xffffffff00000000;
  return QVar12;
}

Assistant:

QRect QToolBarAreaLayout::rectHint(const QRect &r) const
{
    int coef = visible ? 1 : -1;

    QRect result = r;

    QSize left_hint = docks[QInternal::LeftDock].sizeHint();
    QSize right_hint = docks[QInternal::RightDock].sizeHint();
    QSize top_hint = docks[QInternal::TopDock].sizeHint();
    QSize bottom_hint = docks[QInternal::BottomDock].sizeHint();

    result.adjust(-left_hint.width()*coef, -top_hint.height()*coef,
                    right_hint.width()*coef, bottom_hint.height()*coef);

    return result;
}